

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::Object::readGL
          (Object *this,SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync,
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
          *deps)

{
  FenceSync *this_00;
  
  this_00 = (this->m_modifySync).m_ptr;
  if (this_00 != (FenceSync *)0x0) {
    FenceSync::addWaiter(this_00);
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::push_back(deps,&this->m_modifySync);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::push_back(&this->m_readSyncs,sync);
  return;
}

Assistant:

void Object::readGL (SharedPtr<FenceSync> sync, std::vector<SharedPtr<FenceSync> >& deps)
{
	if (m_modifySync)
		m_modifySync->addWaiter();

	// Make call depend on last modifying call
	deps.push_back(m_modifySync);

	// Add read dependency
	m_readSyncs.push_back(sync);
}